

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void CLIntercept::eventCallbackCaller(cl_event event,cl_int status,void *user_data)

{
  CLIntercept *this;
  uint64_t enqueueCounter_00;
  SConfig *pSVar1;
  undefined8 uVar2;
  char *functionName;
  cl_int extraout_var;
  undefined8 *in_RDX;
  cl_int in_ESI;
  cl_event in_RDI;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  SEventCallbackInfo *pEventCallbackInfo;
  CLIntercept *in_stack_ffffffffffffff18;
  cl_event p_Var3;
  CEnumNameMap *in_stack_ffffffffffffff58;
  allocator local_91;
  string local_90 [16];
  cl_sync_point_khr *in_stack_ffffffffffffff80;
  cl_event *in_stack_ffffffffffffff88;
  cl_int errorCode;
  CLIntercept *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffaf;
  string *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  CLIntercept *in_stack_ffffffffffffffc0;
  time_point in_stack_ffffffffffffffc8;
  time_point tickStart;
  
  this = (CLIntercept *)*in_RDX;
  enqueueCounter_00 = getEnqueueCounter(in_stack_ffffffffffffff18);
  pSVar1 = config(this);
  tickStart.__d.__r = (duration)(duration)enqueueCounter_00;
  if ((pSVar1->CallLogging & 1U) != 0) {
    p_Var3 = in_RDI;
    enumName(this);
    CEnumNameMap::name_command_exec_status_abi_cxx11_
              (in_stack_ffffffffffffff58,(cl_command_exec_status)((ulong)p_Var3 >> 0x20));
    uVar2 = std::__cxx11::string::c_str();
    callLoggingEnter(this,"eventCallbackCaller",enqueueCounter_00,(cl_kernel)0x0,
                     "event = %p, status = %s (%d)",p_Var3,uVar2,in_ESI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  functionName = (char *)std::chrono::_V2::steady_clock::now();
  eventCallback(this,in_RDI,in_ESI);
  if (in_RDX[1] != 0) {
    (*(code *)in_RDX[1])(in_RDI,in_ESI,in_RDX[2]);
  }
  std::chrono::_V2::steady_clock::now();
  errorCode = extraout_var;
  pSVar1 = config(this);
  if ((pSVar1->CallLogging & 1U) != 0) {
    callLoggingExit(in_stack_ffffffffffffffa0,functionName,errorCode,in_stack_ffffffffffffff88,
                    in_stack_ffffffffffffff80);
  }
  pSVar1 = config(this);
  if ((pSVar1->ChromeCallLogging & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",&local_91);
    chromeCallLoggingExit
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               (bool)in_stack_ffffffffffffffaf,(uint64_t)in_stack_ffffffffffffffa0,tickStart,
               in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (in_RDX != (undefined8 *)0x0) {
    operator_delete(in_RDX);
  }
  return;
}

Assistant:

void CLIntercept::eventCallbackCaller(
    cl_event event,
    cl_int status,
    void* user_data )
{
    SEventCallbackInfo* pEventCallbackInfo =
        (SEventCallbackInfo*)user_data;

    CLIntercept*    pIntercept = pEventCallbackInfo->pIntercept;

    GET_ENQUEUE_COUNTER();
    CALL_LOGGING_ENTER( "event = %p, status = %s (%d)",
        event,
        pIntercept->enumName().name_command_exec_status( status ).c_str(),
        status );

    clock::time_point   cpuStart = clock::now();

    pIntercept->eventCallback(
        event,
        status );
    if( pEventCallbackInfo->pApplicationCallback )
    {
        pEventCallbackInfo->pApplicationCallback(
            event,
            status,
            pEventCallbackInfo->pUserData );
    }

    clock::time_point   cpuEnd = clock::now();

    CALL_LOGGING_EXIT( CL_SUCCESS );

    delete pEventCallbackInfo;
}